

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotateVector.h
# Opt level: O3

Vector3T<float> __thiscall
Gs::RotateVectorAroundAxis<float>(Gs *this,Vector3T<float> *vec,Vector3T<float> *axis,Real angle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t i;
  long lVar3;
  float result_2;
  float result_3;
  float fVar4;
  Vector3T<float> VVar5;
  Vector<float,_3UL> result;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  Vector<float,_3UL> local_48;
  float local_38;
  
  Normalize<Gs::Vector<float,3ul>,float>(&local_48,axis);
  axis->z = local_48.z;
  axis->x = local_48.x;
  axis->y = local_48.y;
  local_38 = sinf(angle);
  VVar5.z = cosf(angle);
  fVar4 = 1.0 - VVar5.z;
  VVar5.x = axis->z;
  uVar1 = axis->x;
  uVar2 = axis->y;
  local_48.x = (float)uVar1 * (float)uVar1 + (1.0 - (float)uVar1 * (float)uVar1) * VVar5.z;
  local_48.y = fVar4 * (float)uVar1 * (float)uVar2 + -local_38 * VVar5.x;
  local_48.z = VVar5.x * (float)uVar1 * fVar4 + local_38 * (float)uVar2;
  local_58 = CONCAT44((float)uVar2 * (float)uVar2 + (1.0 - (float)uVar2 * (float)uVar2) * VVar5.z,
                      fVar4 * (float)uVar1 * (float)uVar2 + VVar5.x * local_38);
  local_50 = VVar5.x * (float)uVar2 * fVar4 - (float)uVar1 * local_38;
  local_68 = CONCAT44(fVar4 * VVar5.x * (float)uVar2 + (float)uVar1 * local_38,
                      fVar4 * VVar5.x * (float)uVar1 + (float)uVar2 * -local_38);
  local_60 = (1.0 - VVar5.x * VVar5.x) * VVar5.z + VVar5.x * VVar5.x;
  VVar5.x = 0.0;
  lVar3 = 0;
  do {
    VVar5.x = VVar5.x + (&vec->x)[lVar3] * (&local_48.x)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  VVar5.z = 0.0;
  lVar3 = 0;
  do {
    VVar5.z = VVar5.z + (&vec->x)[lVar3] * *(float *)((long)&local_58 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  fVar4 = 0.0;
  lVar3 = 0;
  do {
    fVar4 = fVar4 + (&vec->x)[lVar3] * *(float *)((long)&local_68 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  *(float *)this = VVar5.x;
  *(float *)(this + 4) = VVar5.z;
  *(float *)(this + 8) = fVar4;
  VVar5.y = 0.0;
  return VVar5;
}

Assistant:

Vector3T<T> RotateVectorAroundAxis(const Vector3T<T>& vec, Vector3T<T> axis, Real angle)
{
    axis.Normalize();

    auto s       = std::sin(angle);
    auto c       = std::cos(angle);
    auto cInv    = Real(1) - c;

    Vector3T<T> row0, row1, row2;

    row0.x = axis.x*axis.x + c*(Real(1) - axis.x*axis.x);
    row0.y = axis.x*axis.y*cInv - s*axis.z;
    row0.z = axis.x*axis.z*cInv + s*axis.y;

    row1.x = axis.x*axis.y*cInv + s*axis.z;
    row1.y = axis.y*axis.y + c*(Real(1) - axis.y*axis.y);
    row1.z = axis.y*axis.z*cInv - s*axis.x;

    row2.x = axis.x*axis.z*cInv - s*axis.y;
    row2.y = axis.y*axis.z*cInv + s*axis.x;
    row2.z = axis.z*axis.z + c*(Real(1) - axis.z*axis.z);

    return Vector3T<T>(
        Dot(vec, row0),
        Dot(vec, row1),
        Dot(vec, row2)
    );
}